

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O1

void Eigen::internal::
     nnls_householder_qr_inplace_update<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
               (Matrix<float,__1,__1,_0,__1,__1> *mat,Matrix<float,__1,_1,_0,__1,_1> *hCoeffs,
               Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *newColumn,Index k,
               Scalar *tempData)

{
  Matrix<float,__1,__1,_0,__1,__1> *pMVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  Scalar *__ptr;
  undefined8 *puVar6;
  ulong uVar7;
  char *__function;
  long lVar8;
  long lVar9;
  Matrix<float,__1,__1,_0,__1,__1> *pMVar10;
  RealScalar beta;
  Scalar *local_128;
  MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> local_110;
  Matrix<float,__1,__1,_0,__1,__1> *local_f8;
  long local_f0;
  Index local_e8;
  Matrix<float,__1,__1,_0,__1,__1> *local_e0;
  undefined8 local_d8;
  Index local_d0;
  long local_c8;
  ulong local_c0;
  Index local_b0;
  Matrix<float,__1,__1,_0,__1,__1> *local_a8;
  long local_a0;
  VectorBlock<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1> local_98;
  
  uVar7 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if ((long)uVar7 <= k) {
    __assert_fail("k < mat.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x102,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  pMVar10 = (Matrix<float,__1,__1,_0,__1,__1> *)
            (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_a8 = (Matrix<float,__1,__1,_0,__1,__1> *)((long)pMVar10 - k);
  if (local_a8 == (Matrix<float,__1,__1,_0,__1,__1> *)0x0 || (long)pMVar10 < k) {
    __assert_fail("k < rows",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x103,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  if ((hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar7) {
    __assert_fail("hCoeffs.size() == mat.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x104,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  if ((Matrix<float,__1,__1,_0,__1,__1> *)
      (newColumn->
      super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value != pMVar10) {
    __assert_fail("newColumn.size() == rows",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x105,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  if (tempData == (Scalar *)0x0) {
    if ((long)uVar7 < 0) {
      __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x130,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                   );
    }
    if (uVar7 == 0) {
      __ptr = (Scalar *)0x0;
      local_128 = (Scalar *)0x0;
    }
    else {
      if (uVar7 >> 0x3e != 0) {
LAB_001708fd:
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = boost::program_options::detail::cmdline::cmdline;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      __ptr = (Scalar *)malloc(uVar7 * 4);
      if (3 < uVar7 && ((ulong)__ptr & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_128 = __ptr;
      if (__ptr == (Scalar *)0x0) goto LAB_001708fd;
    }
  }
  else {
    __ptr = (Scalar *)0x0;
    local_128 = tempData;
  }
  pfVar3 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_110.super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
  m_data = pfVar3 + (long)pMVar10 * k;
  local_110.super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
  m_rows.m_value = (long)pMVar10;
  if (-1 < (long)pMVar10 || pfVar3 == (float *)0x0) {
    local_f0 = 0;
    local_f8 = mat;
    local_e8 = k;
    local_e0 = pMVar10;
    if (k < 0) {
LAB_00170c2c:
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                    ,0x7a,
                    "Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                   );
    }
    local_f8 = mat;
    MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::operator=
              (&local_110,
               (MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
               newColumn);
    if (k != 0) {
      local_a0 = -(long)pMVar10;
      lVar8 = 0;
      lVar9 = 0;
      do {
        pfVar3 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar4 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
        if (lVar4 < 0 && pfVar3 != (float *)0x0) goto LAB_00170c81;
        lVar5 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols;
        if (lVar5 <= k) goto LAB_00170c2c;
        pMVar1 = (Matrix<float,__1,__1,_0,__1,__1> *)(pfVar3 + lVar4 * k);
        uVar7 = local_a0 + lVar9 + lVar4;
        local_110.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = (PointerType)
               ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data + uVar7 * 4);
        local_110.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
        m_value = (long)pMVar10;
        if ((long)pMVar10 < 0 && pfVar3 != (float *)0x0) goto LAB_00170c4b;
        local_d8 = 0;
        local_b0 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                   m_rows;
        local_f8 = pMVar1;
        local_c8 = lVar4;
        local_c0 = uVar7;
        if ((long)(uVar7 | (ulong)pMVar10) < 0) goto LAB_00170c62;
        local_f0 = lVar4;
        local_e0 = mat;
        local_d0 = k;
        if (lVar5 <= lVar9) goto LAB_00170c2c;
        pfVar2 = pfVar3 + lVar4 * lVar9;
        pMVar1 = (Matrix<float,__1,__1,_0,__1,__1> *)
                 ((long)&pMVar10[-1].super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                         .m_storage.m_cols + 7);
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
        .m_data = pfVar2 + uVar7 + 1;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
        .m_rows.m_value = (long)pMVar1;
        if ((long)pMVar10 < 1 && pfVar3 != (float *)0x0) goto LAB_00170c4b;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .m_startRow.m_value = lVar4 + local_a0 + lVar9 + 1;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow
        .m_value = 0;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .m_outerStride =
             (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows
        ;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = pfVar2;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
        m_value = lVar4;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             mat;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol
        .m_value = lVar9;
        local_98.
        super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
        .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride = lVar4;
        if ((long)(local_98.
                   super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
                   .
                   super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
                   .m_startRow.m_value | (ulong)pMVar1) < 0) goto LAB_00170c62;
        MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>>
        ::
        applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1>>
                  ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>>
                    *)&local_110,&local_98,
                   (Scalar *)
                   ((long)(hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data + lVar8),(Scalar *)((long)local_128 + lVar8 + 4));
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 4;
        pMVar10 = pMVar1;
      } while (k != lVar9);
    }
    pfVar3 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data
    ;
    lVar8 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    if (-1 < lVar8 || pfVar3 == (float *)0x0) {
      if ((mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols <=
          k) goto LAB_00170c2c;
      pMVar10 = (Matrix<float,__1,__1,_0,__1,__1> *)(pfVar3 + lVar8 * k);
      uVar7 = lVar8 - (long)local_a8;
      local_110.super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
      .m_data = (PointerType)((long)pMVar10 + uVar7 * 4);
      local_110.super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
      .m_rows.m_value = (long)local_a8;
      if (-1 < (long)local_a8 || pfVar3 == (float *)0x0) {
        local_d8 = 0;
        local_b0 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                   m_rows;
        local_f8 = pMVar10;
        local_c8 = lVar8;
        local_c0 = uVar7;
        if (-1 < (long)((ulong)local_a8 | uVar7)) {
          local_f0 = lVar8;
          local_e0 = mat;
          local_d0 = k;
          MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
          ::makeHouseholderInPlace
                    ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                      *)&local_110,
                     (hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data + k,(RealScalar *)&local_98);
          (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data
          [(mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows *
           k + k] = local_98.
                    super_Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
                    .
                    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
                    .m_data._0_4_;
          free(__ptr);
          return;
        }
LAB_00170c62:
        local_d8 = 0;
        local_f0 = local_c8;
        local_e0 = mat;
        local_d0 = k;
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
LAB_00170c4b:
      __function = 
      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1>, Level = 0]"
      ;
      goto LAB_00170c96;
    }
  }
LAB_00170c81:
  __function = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, Level = 0]"
  ;
LAB_00170c96:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

void nnls_householder_qr_inplace_update(MatrixQR& mat, HCoeffs &hCoeffs,
                                        const VectorQR &newColumn,
                                        typename MatrixQR::Index k,
                                        typename MatrixQR::Scalar* tempData = 0)
{
  typedef typename MatrixQR::Index Index;
  typedef typename MatrixQR::Scalar Scalar;
  typedef typename MatrixQR::RealScalar RealScalar;
  Index rows = mat.rows();

  eigen_assert(k < mat.cols());
  eigen_assert(k < rows);
  eigen_assert(hCoeffs.size() == mat.cols());
  eigen_assert(newColumn.size() == rows);

  Matrix<Scalar,Dynamic,1,ColMajor,MatrixQR::MaxColsAtCompileTime,1> tempVector;
  if(tempData == 0) {
    tempVector.resize(mat.cols());
    tempData = tempVector.data();
  }

  // Store new column in mat at column k
  mat.col(k) = newColumn;
  // Apply H = H_1...H_{k-1} on newColumn (skip if k=0)
  for (Index i=0; i<k; ++i) {
    Index remainingRows = rows - i;
    mat.col(k).tail(remainingRows).applyHouseholderOnTheLeft(
          mat.col(i).tail(remainingRows-1), hCoeffs.coeffRef(i), tempData+i+1);
  }
  // Construct Householder projector in-place in column k
  RealScalar beta;
  mat.col(k).tail(rows-k).makeHouseholderInPlace(hCoeffs.coeffRef(k), beta);
  mat.coeffRef(k,k) = beta;
}